

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddCustomTargetCommand.cxx
# Opt level: O0

bool cmAddCustomTargetCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer *__return_storage_ptr__;
  cmExecutionStatus *pcVar1;
  bool bVar2;
  cmMakefile *this;
  const_reference input;
  long lVar3;
  size_type sVar4;
  const_reference __lhs;
  size_type sVar5;
  string *a;
  char *pcVar6;
  ulong uVar7;
  pointer pcVar8;
  cmTarget *this_00;
  string_view val;
  byte local_43a;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_3b8;
  cmTarget *local_3b0;
  cmTarget *target;
  char *local_3a0;
  cmCustomCommandLines local_398;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_380;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_368;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_350;
  __single_object cc;
  string local_340;
  allocator<char> local_319;
  string local_318;
  allocator<char> local_2f1;
  string local_2f0;
  allocator<char> local_2c9;
  string local_2c8;
  undefined1 local_2a8 [8];
  string msg;
  undefined1 local_280 [7];
  bool nameOk;
  long local_260;
  size_type pos;
  string local_250;
  undefined1 local_230 [8];
  string dep;
  char local_1e9;
  string local_1e8;
  undefined1 local_1c8 [8];
  string filename;
  string *copy;
  uint j;
  uint start;
  string local_190 [3];
  bool excludeFromAll;
  tdoing doing;
  string job_server_aware;
  string job_pool;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sources;
  char *comment;
  string comment_buffer;
  string local_108 [5];
  bool command_expand_lists;
  bool uses_terminal;
  bool verbatim;
  string working_directory;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  byproducts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  cmCustomCommandLines commandLines;
  cmCustomCommandLine currentLine;
  string *targetName;
  cmMakefile *mf;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  pcVar1 = local_20;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"called with incorrect number of arguments",&local_41);
    cmExecutionStatus::SetError(pcVar1,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
  }
  else {
    this = cmExecutionStatus::GetMakefile(local_20);
    input = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)status_local,0);
    lVar3 = std::__cxx11::string::find_first_of((char *)input,0x113b884);
    pcVar1 = local_20;
    if (lVar3 == -1) {
      cmCustomCommandLine::cmCustomCommandLine
                ((cmCustomCommandLine *)
                 &commandLines.
                  super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      cmCustomCommandLines::cmCustomCommandLines
                ((cmCustomCommandLines *)
                 &depends.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&byproducts.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&working_directory.field_2 + 8));
      std::__cxx11::string::string(local_108);
      comment_buffer.field_2._M_local_buf[0xf] = '\0';
      comment_buffer.field_2._M_local_buf[0xe] = '\0';
      comment_buffer.field_2._M_local_buf[0xd] = '\0';
      std::__cxx11::string::string((string *)&comment);
      sources.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&job_pool.field_2 + 8));
      std::__cxx11::string::string((string *)(job_server_aware.field_2._M_local_buf + 8));
      std::__cxx11::string::string(local_190);
      start = 0;
      j._3_1_ = true;
      copy._4_4_ = 1;
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)status_local);
      if (1 < sVar4) {
        __lhs = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)status_local,1);
        bVar2 = std::operator==(__lhs,"ALL");
        if (bVar2) {
          copy._4_4_ = 2;
        }
        j._3_1_ = !bVar2;
      }
      for (copy._0_4_ = copy._4_4_;
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)status_local), (uint)copy < sVar4; copy._0_4_ = (uint)copy + 1) {
        filename.field_2._8_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,(ulong)(uint)copy);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )filename.field_2._8_8_,"DEPENDS");
        if (bVar2) {
          start = 1;
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)filename.field_2._8_8_,"BYPRODUCTS");
          if (bVar2) {
            start = 2;
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)filename.field_2._8_8_,"WORKING_DIRECTORY");
            if (bVar2) {
              start = 3;
            }
            else {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)filename.field_2._8_8_,"VERBATIM");
              if (bVar2) {
                start = 8;
                comment_buffer.field_2._M_local_buf[0xf] = '\x01';
              }
              else {
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)filename.field_2._8_8_,"USES_TERMINAL");
                if (bVar2) {
                  start = 8;
                  comment_buffer.field_2._M_local_buf[0xe] = '\x01';
                }
                else {
                  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)filename.field_2._8_8_,"COMMAND_EXPAND_LISTS");
                  if (bVar2) {
                    start = 8;
                    comment_buffer.field_2._M_local_buf[0xd] = '\x01';
                  }
                  else {
                    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)filename.field_2._8_8_,"COMMENT");
                    if (bVar2) {
                      start = 4;
                    }
                    else {
                      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)filename.field_2._8_8_,"JOB_POOL");
                      if (bVar2) {
                        start = 6;
                      }
                      else {
                        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)filename.field_2._8_8_,"JOB_SERVER_AWARE");
                        if (bVar2) {
                          start = 7;
                        }
                        else {
                          bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)filename.field_2._8_8_,"COMMAND");
                          if (bVar2) {
                            start = 0;
                            bVar2 = std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)&commandLines.
                                                super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                                .
                                                super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
                            if (!bVar2) {
                              std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                              ::push_back((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                           *)&depends.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                          (value_type *)
                                          &commandLines.
                                           super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                           .
                                           super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)&commandLines.
                                          super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                          .
                                          super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                            }
                          }
                          else {
                            bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)filename.field_2._8_8_,"SOURCES");
                            pcVar1 = local_20;
                            if (bVar2) {
                              start = 5;
                            }
                            else {
                              switch(start) {
                              case 0:
                                std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)&commandLines.
                                                super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                                .
                                                super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                            (value_type *)filename.field_2._8_8_);
                                break;
                              case 1:
                                std::__cxx11::string::string
                                          ((string *)local_230,(string *)filename.field_2._8_8_);
                                cmsys::SystemTools::ConvertToUnixSlashes((string *)local_230);
                                std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)&byproducts.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                            (value_type *)local_230);
                                std::__cxx11::string::~string((string *)local_230);
                                break;
                              case 2:
                                std::__cxx11::string::string((string *)local_1c8);
                                bVar2 = cmsys::SystemTools::FileIsFullPath
                                                  ((string *)filename.field_2._8_8_);
                                if ((!bVar2) &&
                                   (sVar5 = cmGeneratorExpression::Find(filename.field_2._8_8_),
                                   sVar5 != 0)) {
                                  a = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
                                  local_1e9 = '/';
                                  cmStrCat<std::__cxx11::string_const&,char>
                                            (&local_1e8,a,&local_1e9);
                                  std::__cxx11::string::operator=
                                            ((string *)local_1c8,(string *)&local_1e8);
                                  std::__cxx11::string::~string((string *)&local_1e8);
                                }
                                std::__cxx11::string::operator+=
                                          ((string *)local_1c8,(string *)filename.field_2._8_8_);
                                cmsys::SystemTools::ConvertToUnixSlashes((string *)local_1c8);
                                bVar2 = cmsys::SystemTools::FileIsFullPath((string *)local_1c8);
                                if (bVar2) {
                                  cmsys::SystemTools::CollapseFullPath
                                            ((string *)((long)&dep.field_2 + 8),(string *)local_1c8)
                                  ;
                                  std::__cxx11::string::operator=
                                            ((string *)local_1c8,
                                             (string *)(dep.field_2._M_local_buf + 8));
                                  std::__cxx11::string::~string
                                            ((string *)(dep.field_2._M_local_buf + 8));
                                }
                                std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)((long)&working_directory.field_2 + 8),
                                            (value_type *)local_1c8);
                                std::__cxx11::string::~string((string *)local_1c8);
                                break;
                              case 3:
                                std::__cxx11::string::operator=
                                          (local_108,(string *)filename.field_2._8_8_);
                                break;
                              case 4:
                                std::__cxx11::string::operator=
                                          ((string *)&comment,(string *)filename.field_2._8_8_);
                                sources.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                     (pointer)std::__cxx11::string::c_str();
                                break;
                              case 5:
                                std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)((long)&job_pool.field_2 + 8),
                                            (value_type *)filename.field_2._8_8_);
                                break;
                              case 6:
                                std::__cxx11::string::operator=
                                          ((string *)(job_server_aware.field_2._M_local_buf + 8),
                                           (string *)filename.field_2._8_8_);
                                break;
                              case 7:
                                std::__cxx11::string::operator=
                                          (local_190,(string *)filename.field_2._8_8_);
                                break;
                              default:
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_250,
                                           "Wrong syntax. Unknown type of argument.",
                                           (allocator<char> *)((long)&pos + 7));
                                cmExecutionStatus::SetError(pcVar1,&local_250);
                                std::__cxx11::string::~string((string *)&local_250);
                                std::allocator<char>::~allocator
                                          ((allocator<char> *)((long)&pos + 7));
                                args_local._7_1_ = 0;
                                pos._0_4_ = 1;
                                goto LAB_00608bed;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      local_260 = std::__cxx11::string::find_first_of((char *)input,0x111b586);
      pcVar1 = local_20;
      if (local_260 == -1) {
        bVar2 = cmGeneratorExpression::IsValidTargetName(input);
        local_43a = 0;
        if (bVar2) {
          bVar2 = cmGlobalGenerator::IsReservedTarget(input);
          local_43a = bVar2 ^ 0xff;
        }
        msg.field_2._M_local_buf[0xf] = local_43a & 1;
        if (msg.field_2._M_local_buf[0xf] != 0) {
          lVar3 = std::__cxx11::string::find((char)input,0x3a);
          msg.field_2._M_local_buf[0xf] = lVar3 == -1;
        }
        if ((msg.field_2._M_local_buf[0xf] != '\0') ||
           (bVar2 = cmMakefile::CheckCMP0037(this,input,UTILITY), bVar2)) {
          bVar2 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&commandLines.
                              super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                              .
                              super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (!bVar2) {
            std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                      ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                       &depends.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (value_type *)
                       &commandLines.
                        super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                        super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&commandLines.
                        super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                        super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          std::__cxx11::string::string((string *)local_2a8);
          bVar2 = cmMakefile::EnforceUniqueName(this,input,(string *)local_2a8,true);
          if (!bVar2) {
            cmExecutionStatus::SetError(local_20,(string *)local_2a8);
            args_local._7_1_ = 0;
          }
          pos._0_4_ = (uint)!bVar2;
          std::__cxx11::string::~string((string *)local_2a8);
          if ((uint)pos == 0) {
            bVar2 = std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::empty
                              ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                               &depends.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
            if ((!bVar2) ||
               (bVar2 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)((long)&working_directory.field_2 + 8)), bVar2)) {
              bVar2 = std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::empty
                                ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                  *)&depends.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
              if ((bVar2) && ((comment_buffer.field_2._M_local_buf[0xe] & 1U) != 0)) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2f0,
                           "USES_TERMINAL may not be specified without any COMMAND",&local_2f1);
                cmMakefile::IssueMessage(this,FATAL_ERROR,&local_2f0);
                std::__cxx11::string::~string((string *)&local_2f0);
                std::allocator<char>::~allocator(&local_2f1);
                args_local._7_1_ = 1;
                pos._0_4_ = 1;
              }
              else {
                bVar2 = std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
                        empty((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                              &depends.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
                if ((bVar2) && ((comment_buffer.field_2._M_local_buf[0xd] & 1U) != 0)) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_318,
                             "COMMAND_EXPAND_LISTS may not be specified without any COMMAND",
                             &local_319);
                  cmMakefile::IssueMessage(this,FATAL_ERROR,&local_318);
                  std::__cxx11::string::~string((string *)&local_318);
                  std::allocator<char>::~allocator(&local_319);
                  args_local._7_1_ = 1;
                  pos._0_4_ = 1;
                }
                else if (((comment_buffer.field_2._M_local_buf[0xe] & 1U) == 0) ||
                        (uVar7 = std::__cxx11::string::empty(), pcVar1 = local_20, (uVar7 & 1) != 0)
                        ) {
                  std::make_unique<cmCustomCommand>();
                  pcVar8 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::
                           operator->(&local_350);
                  pcVar6 = (char *)std::__cxx11::string::c_str();
                  cmCustomCommand::SetWorkingDirectory(pcVar8,pcVar6);
                  pcVar8 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::
                           operator->(&local_350);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_368,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)((long)&working_directory.field_2 + 8));
                  cmCustomCommand::SetByproducts(pcVar8,&local_368);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_368);
                  pcVar8 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::
                           operator->(&local_350);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_380,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&byproducts.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  cmCustomCommand::SetDepends(pcVar8,&local_380);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_380);
                  pcVar8 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::
                           operator->(&local_350);
                  cmCustomCommandLines::cmCustomCommandLines
                            (&local_398,
                             (cmCustomCommandLines *)
                             &depends.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  cmCustomCommand::SetCommandLines(pcVar8,&local_398);
                  cmCustomCommandLines::~cmCustomCommandLines(&local_398);
                  pcVar8 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::
                           operator->(&local_350);
                  cmCustomCommand::SetEscapeOldStyle
                            (pcVar8,(bool)(~comment_buffer.field_2._M_local_buf[0xf] & 1));
                  pcVar8 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::
                           operator->(&local_350);
                  cmCustomCommand::SetComment
                            (pcVar8,(char *)sources.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  pcVar8 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::
                           operator->(&local_350);
                  cmCustomCommand::SetUsesTerminal
                            (pcVar8,(bool)(comment_buffer.field_2._M_local_buf[0xe] & 1));
                  pcVar8 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::
                           operator->(&local_350);
                  cmCustomCommand::SetCommandExpandLists
                            (pcVar8,(bool)(comment_buffer.field_2._M_local_buf[0xd] & 1));
                  pcVar8 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::
                           operator->(&local_350);
                  cmCustomCommand::SetJobPool
                            (pcVar8,(string *)((long)&job_server_aware.field_2 + 8));
                  pcVar8 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::
                           operator->(&local_350);
                  val = (string_view)
                        std::__cxx11::string::operator_cast_to_basic_string_view(local_190);
                  local_3a0 = val._M_str;
                  target = (cmTarget *)val._M_len;
                  bVar2 = cmIsOn(val);
                  cmCustomCommand::SetJobserverAware(pcVar8,bVar2);
                  std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::
                  unique_ptr(&local_3b8,&local_350);
                  this_00 = cmMakefile::AddUtilityCommand(this,input,j._3_1_,&local_3b8);
                  std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::
                  ~unique_ptr(&local_3b8);
                  local_3b0 = this_00;
                  cmTarget::AddSources
                            (this_00,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)((long)&job_pool.field_2 + 8));
                  args_local._7_1_ = 1;
                  pos._0_4_ = 1;
                  std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::
                  ~unique_ptr(&local_350);
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_340,"JOB_POOL is shadowed by USES_TERMINAL.",
                             (allocator<char> *)
                             ((long)&cc._M_t.
                                     super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                                     .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl +
                             7));
                  cmExecutionStatus::SetError(pcVar1,&local_340);
                  std::__cxx11::string::~string((string *)&local_340);
                  std::allocator<char>::~allocator
                            ((allocator<char> *)
                             ((long)&cc._M_t.
                                     super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                                     .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl +
                             7));
                  args_local._7_1_ = 0;
                  pos._0_4_ = 1;
                }
              }
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_2c8,"BYPRODUCTS may not be specified without any COMMAND",
                         &local_2c9);
              cmMakefile::IssueMessage(this,FATAL_ERROR,&local_2c8);
              std::__cxx11::string::~string((string *)&local_2c8);
              std::allocator<char>::~allocator(&local_2c9);
              args_local._7_1_ = 1;
              pos._0_4_ = 1;
            }
          }
        }
        else {
          args_local._7_1_ = 0;
          pos._0_4_ = 1;
        }
      }
      else {
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)input);
        cmStrCat<char_const(&)[39],char_const&,char_const(&)[35]>
                  ((string *)local_280,(char (*) [39])"called with target name containing a \"",
                   pcVar6,(char (*) [35])"\".  This character is not allowed.");
        cmExecutionStatus::SetError(pcVar1,(string *)local_280);
        std::__cxx11::string::~string((string *)local_280);
        args_local._7_1_ = 0;
        pos._0_4_ = 1;
      }
LAB_00608bed:
      std::__cxx11::string::~string(local_190);
      std::__cxx11::string::~string((string *)(job_server_aware.field_2._M_local_buf + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&job_pool.field_2 + 8));
      std::__cxx11::string::~string((string *)&comment);
      std::__cxx11::string::~string(local_108);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&working_directory.field_2 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&byproducts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cmCustomCommandLines::~cmCustomCommandLines
                ((cmCustomCommandLines *)
                 &depends.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cmCustomCommandLine::~cmCustomCommandLine
                ((cmCustomCommandLine *)
                 &commandLines.
                  super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    else {
      __return_storage_ptr__ =
           &currentLine.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
      cmStrCat<char_const(&)[34],std::__cxx11::string_const&,char_const(&)[85]>
                ((string *)__return_storage_ptr__,
                 (char (*) [34])"called with invalid target name \"",input,
                 (char (*) [85])
                 "\".  Target names may not contain a slash.  Use ADD_CUSTOM_COMMAND to generate files."
                );
      cmExecutionStatus::SetError(pcVar1,(string *)__return_storage_ptr__);
      std::__cxx11::string::~string
                ((string *)
                 &currentLine.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      args_local._7_1_ = 0;
    }
  }
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool cmAddCustomTargetCommand(std::vector<std::string> const& args,
                              cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();
  std::string const& targetName = args[0];

  // Check the target name.
  if (targetName.find_first_of("/\\") != std::string::npos) {
    status.SetError(cmStrCat("called with invalid target name \"", targetName,
                             "\".  Target names may not contain a slash.  "
                             "Use ADD_CUSTOM_COMMAND to generate files."));
    return false;
  }

  // Accumulate one command line at a time.
  cmCustomCommandLine currentLine;

  // Save all command lines.
  cmCustomCommandLines commandLines;

  // Accumulate dependencies.
  std::vector<std::string> depends;
  std::vector<std::string> byproducts;
  std::string working_directory;
  bool verbatim = false;
  bool uses_terminal = false;
  bool command_expand_lists = false;
  std::string comment_buffer;
  const char* comment = nullptr;
  std::vector<std::string> sources;
  std::string job_pool;
  std::string job_server_aware;

  // Keep track of parser state.
  enum tdoing
  {
    doing_command,
    doing_depends,
    doing_byproducts,
    doing_working_directory,
    doing_comment,
    doing_source,
    doing_job_pool,
    doing_job_server_aware,
    doing_nothing
  };
  tdoing doing = doing_command;

  // Look for the ALL option.
  bool excludeFromAll = true;
  unsigned int start = 1;
  if (args.size() > 1) {
    if (args[1] == "ALL") {
      excludeFromAll = false;
      start = 2;
    }
  }

  // Parse the rest of the arguments.
  for (unsigned int j = start; j < args.size(); ++j) {
    std::string const& copy = args[j];

    if (copy == "DEPENDS") {
      doing = doing_depends;
    } else if (copy == "BYPRODUCTS") {
      doing = doing_byproducts;
    } else if (copy == "WORKING_DIRECTORY") {
      doing = doing_working_directory;
    } else if (copy == "VERBATIM") {
      doing = doing_nothing;
      verbatim = true;
    } else if (copy == "USES_TERMINAL") {
      doing = doing_nothing;
      uses_terminal = true;
    } else if (copy == "COMMAND_EXPAND_LISTS") {
      doing = doing_nothing;
      command_expand_lists = true;
    } else if (copy == "COMMENT") {
      doing = doing_comment;
    } else if (copy == "JOB_POOL") {
      doing = doing_job_pool;
    } else if (copy == "JOB_SERVER_AWARE") {
      doing = doing_job_server_aware;
    } else if (copy == "COMMAND") {
      doing = doing_command;

      // Save the current command before starting the next command.
      if (!currentLine.empty()) {
        commandLines.push_back(currentLine);
        currentLine.clear();
      }
    } else if (copy == "SOURCES") {
      doing = doing_source;
    } else {
      switch (doing) {
        case doing_working_directory:
          working_directory = copy;
          break;
        case doing_command:
          currentLine.push_back(copy);
          break;
        case doing_byproducts: {
          std::string filename;
          if (!cmSystemTools::FileIsFullPath(copy) &&
              cmGeneratorExpression::Find(copy) != 0) {
            filename = cmStrCat(mf.GetCurrentBinaryDirectory(), '/');
          }
          filename += copy;
          cmSystemTools::ConvertToUnixSlashes(filename);
          if (cmSystemTools::FileIsFullPath(filename)) {
            filename = cmSystemTools::CollapseFullPath(filename);
          }
          byproducts.push_back(filename);
        } break;
        case doing_depends: {
          std::string dep = copy;
          cmSystemTools::ConvertToUnixSlashes(dep);
          depends.push_back(std::move(dep));
        } break;
        case doing_comment:
          comment_buffer = copy;
          comment = comment_buffer.c_str();
          break;
        case doing_source:
          sources.push_back(copy);
          break;
        case doing_job_pool:
          job_pool = copy;
          break;
        case doing_job_server_aware:
          job_server_aware = copy;
          break;
        default:
          status.SetError("Wrong syntax. Unknown type of argument.");
          return false;
      }
    }
  }

  std::string::size_type pos = targetName.find_first_of("#<>");
  if (pos != std::string::npos) {
    status.SetError(cmStrCat("called with target name containing a \"",
                             targetName[pos],
                             "\".  This character is not allowed."));
    return false;
  }

  // Some requirements on custom target names already exist
  // and have been checked at this point.
  // The following restrictions overlap but depend on policy CMP0037.
  bool nameOk = cmGeneratorExpression::IsValidTargetName(targetName) &&
    !cmGlobalGenerator::IsReservedTarget(targetName);
  if (nameOk) {
    nameOk = targetName.find(':') == std::string::npos;
  }
  if (!nameOk && !mf.CheckCMP0037(targetName, cmStateEnums::UTILITY)) {
    return false;
  }

  // Store the last command line finished.
  if (!currentLine.empty()) {
    commandLines.push_back(currentLine);
    currentLine.clear();
  }

  // Enforce name uniqueness.
  {
    std::string msg;
    if (!mf.EnforceUniqueName(targetName, msg, true)) {
      status.SetError(msg);
      return false;
    }
  }

  if (commandLines.empty() && !byproducts.empty()) {
    mf.IssueMessage(MessageType::FATAL_ERROR,
                    "BYPRODUCTS may not be specified without any COMMAND");
    return true;
  }
  if (commandLines.empty() && uses_terminal) {
    mf.IssueMessage(MessageType::FATAL_ERROR,
                    "USES_TERMINAL may not be specified without any COMMAND");
    return true;
  }
  if (commandLines.empty() && command_expand_lists) {
    mf.IssueMessage(
      MessageType::FATAL_ERROR,
      "COMMAND_EXPAND_LISTS may not be specified without any COMMAND");
    return true;
  }

  if (uses_terminal && !job_pool.empty()) {
    status.SetError("JOB_POOL is shadowed by USES_TERMINAL.");
    return false;
  }

  // Add the utility target to the makefile.
  auto cc = cm::make_unique<cmCustomCommand>();
  cc->SetWorkingDirectory(working_directory.c_str());
  cc->SetByproducts(byproducts);
  cc->SetDepends(depends);
  cc->SetCommandLines(commandLines);
  cc->SetEscapeOldStyle(!verbatim);
  cc->SetComment(comment);
  cc->SetUsesTerminal(uses_terminal);
  cc->SetCommandExpandLists(command_expand_lists);
  cc->SetJobPool(job_pool);
  cc->SetJobserverAware(cmIsOn(job_server_aware));
  cmTarget* target =
    mf.AddUtilityCommand(targetName, excludeFromAll, std::move(cc));

  // Add additional user-specified source files to the target.
  target->AddSources(sources);

  return true;
}